

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O2

void Ndr_ObjWriteRange(Ndr_Data_t *p,int Obj,FILE *pFile,int fSkipBin)

{
  uint uVar1;
  int *in_RAX;
  ulong uVar2;
  ulong uVar3;
  int *pArray;
  
  pArray = in_RAX;
  uVar1 = Ndr_ObjReadArray(p,Obj,8,&pArray);
  if (fSkipBin != 0 && uVar1 < 2) {
    return;
  }
  if (uVar1 == 3 && fSkipBin != 0) {
    fwrite("signed ",7,1,(FILE *)pFile);
    return;
  }
  if (uVar1 == 0) {
    if (fSkipBin == 0) {
      uVar2 = 0;
LAB_002fee00:
      fprintf((FILE *)pFile,"[%d]",uVar2);
      return;
    }
    uVar2 = 0;
    uVar3 = 0;
  }
  else if (uVar1 == 1) {
    uVar2 = (ulong)(uint)*pArray;
    uVar3 = uVar2;
    if (fSkipBin == 0) goto LAB_002fee00;
  }
  else {
    uVar2 = (ulong)(uint)pArray[1];
    uVar3 = (ulong)(uint)*pArray;
  }
  fprintf((FILE *)pFile,"[%d:%d]",uVar3,uVar2);
  return;
}

Assistant:

static inline void Ndr_ObjWriteRange( Ndr_Data_t * p, int Obj, FILE * pFile, int fSkipBin )
{
    int * pArray, nArray = Ndr_ObjReadArray( p, Obj, NDR_RANGE, &pArray );
    if ( (nArray == 0 || nArray == 1) && fSkipBin )
        return;
    if ( nArray == 3 && fSkipBin )
        fprintf( pFile, "signed " ); 
    else if ( nArray == 1 )
    {
        if ( fSkipBin )
            fprintf( pFile, "[%d:%d]", pArray[0], pArray[0] );
        else
            fprintf( pFile, "[%d]", pArray[0] );
    }
    else if ( nArray == 0 )
    {
        if ( fSkipBin )
            fprintf( pFile, "[%d:%d]", 0, 0 );
        else
            fprintf( pFile, "[%d]", 0 );
    }
    else
        fprintf( pFile, "[%d:%d]", pArray[0], pArray[1] );
}